

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O2

int check_for_multi(vocoldef *dolist)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = voclistlen(dolist);
  uVar3 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar3;
  }
  uVar1 = 0;
  for (; uVar2 * 0x28 - uVar3 != 0; uVar3 = uVar3 + 0x28) {
    uVar1 = uVar1 | *(uint *)((long)&dolist->vocolflg + uVar3) & 0x89;
  }
  return uVar1;
}

Assistant:

static int check_for_multi(vocoldef *dolist)
{
    int dolen;
    int i;
    int result;

    /* presume we won't find any flags */
    result = 0;

    /* 
     *   scan the list for ALL, ANY, or THEM flags, combining any such
     *   flags we find into the result 
     */
    dolen = voclistlen(dolist);
    for (i = 0 ; i < dolen ; ++i)
        result |= (dolist[i].vocolflg & (VOCS_ALL | VOCS_ANY | VOCS_THEM));

    /* return the result */
    return result;
}